

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMotorLinearDriveline::ChLinkMotorLinearDriveline(ChLinkMotorLinearDriveline *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChShaftsBodyTranslation *pCVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined1 local_29;
  ChShaftsBodyTranslation *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  ChLinkMotorLinear::ChLinkMotorLinear(&this->super_ChLinkMotorLinear);
  *(undefined ***)
   &(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.super_ChLinkMate.
    super_ChLink.super_ChLinkBase.super_ChPhysicsItem = &PTR__ChLinkMotorLinearDriveline_00b47c70;
  (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.c_x = false;
  *(undefined8 *)&(this->super_ChLinkMotorLinear).field_0x278 = 0;
  *(undefined8 *)&this->field_0x280 = 0;
  (this->innershaft2lin).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->innershaft2lin).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->innershaft2rot).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->innershaft2rot).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->innerconstraint1lin).
  super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->innerconstraint1lin).
  super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->innerconstraint1lin).
  super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->innerconstraint2lin).
  super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->innerconstraint2lin).
  super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->innerconstraint2rot).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->innerconstraint2rot).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->shaft2_rotation_dir).m_data[0] = 0.0;
  (this->shaft2_rotation_dir).m_data[1] = 0.0;
  (this->shaft2_rotation_dir).m_data[2] = 0.0;
  ChLinkMateGeneric::SetupLinkMask((ChLinkMateGeneric *)this);
  local_28 = (ChShaftsBodyTranslation *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaft,std::allocator<chrono::ChShaft>>
            (a_Stack_20,(ChShaft **)&local_28,(allocator<chrono::ChShaft> *)&local_29);
  _Var3._M_pi = a_Stack_20[0]._M_pi;
  pCVar2 = local_28;
  local_28 = (ChShaftsBodyTranslation *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x280;
  *(ChShaftsBodyTranslation **)&(this->super_ChLinkMotorLinear).field_0x278 = pCVar2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x280 = _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  local_28 = (ChShaftsBodyTranslation *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaft,std::allocator<chrono::ChShaft>>
            (a_Stack_20,(ChShaft **)&local_28,(allocator<chrono::ChShaft> *)&local_29);
  _Var3._M_pi = a_Stack_20[0]._M_pi;
  pCVar2 = local_28;
  local_28 = (ChShaftsBodyTranslation *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->innershaft2lin).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->innershaft2lin).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pCVar2;
  (this->innershaft2lin).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  local_28 = (ChShaftsBodyTranslation *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaft,std::allocator<chrono::ChShaft>>
            (a_Stack_20,(ChShaft **)&local_28,(allocator<chrono::ChShaft> *)&local_29);
  _Var3._M_pi = a_Stack_20[0]._M_pi;
  pCVar2 = local_28;
  local_28 = (ChShaftsBodyTranslation *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->innershaft2rot).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->innershaft2rot).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pCVar2;
  (this->innershaft2rot).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  local_28 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaftsBodyTranslation,std::allocator<chrono::ChShaftsBodyTranslation>>
            (a_Stack_20,&local_28,(allocator<chrono::ChShaftsBodyTranslation> *)&local_29);
  _Var3._M_pi = a_Stack_20[0]._M_pi;
  pCVar2 = local_28;
  local_28 = (ChShaftsBodyTranslation *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->innerconstraint1lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->innerconstraint1lin).
  super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pCVar2;
  (this->innerconstraint1lin).
  super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  local_28 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaftsBodyTranslation,std::allocator<chrono::ChShaftsBodyTranslation>>
            (a_Stack_20,&local_28,(allocator<chrono::ChShaftsBodyTranslation> *)&local_29);
  _Var3._M_pi = a_Stack_20[0]._M_pi;
  pCVar2 = local_28;
  local_28 = (ChShaftsBodyTranslation *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->innerconstraint2lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->innerconstraint2lin).
  super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pCVar2;
  (this->innerconstraint2lin).
  super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  local_28 = (ChShaftsBodyTranslation *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaftsBody,std::allocator<chrono::ChShaftsBody>>
            (a_Stack_20,(ChShaftsBody **)&local_28,(allocator<chrono::ChShaftsBody> *)&local_29);
  _Var3._M_pi = a_Stack_20[0]._M_pi;
  pCVar2 = local_28;
  local_28 = (ChShaftsBodyTranslation *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->innerconstraint2rot).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->innerconstraint2rot).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pCVar2;
  (this->innerconstraint2rot).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  if (this != (ChLinkMotorLinearDriveline *)(sBulletDNAstr64 + 0x3548)) {
    (this->shaft2_rotation_dir).m_data[0] = VECT_X;
    (this->shaft2_rotation_dir).m_data[1] = DAT_00b90ad8;
    (this->shaft2_rotation_dir).m_data[2] = DAT_00b90ae0;
  }
  return;
}

Assistant:

ChLinkMotorLinearDriveline::ChLinkMotorLinearDriveline() {
    
    this->c_x = false;
    SetupLinkMask();

    innershaft1lin = chrono_types::make_shared<ChShaft>();
    innershaft2lin = chrono_types::make_shared<ChShaft>();
    innershaft2rot = chrono_types::make_shared<ChShaft>();
    innerconstraint1lin = chrono_types::make_shared<ChShaftsBodyTranslation>();
    innerconstraint2lin = chrono_types::make_shared<ChShaftsBodyTranslation>(); 
    innerconstraint2rot = chrono_types::make_shared<ChShaftsBody>(); 
    shaft2_rotation_dir = VECT_X;
}